

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plf_stack.h
# Opt level: O0

void __thiscall
plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::initialize
          (stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this)

{
  element_pointer_type pMVar1;
  pointer_conflict pgVar2;
  stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_> *this_local;
  
  pgVar2 = std::
           allocator_traits<std::allocator<plf::stack<MatchingStateDebugFailures,_std::allocator<MatchingStateDebugFailures>_>::group>_>
           ::allocate((allocator_type *)&this->group_allocator_pair,1,(const_void_pointer)0x0);
  this->current_group = pgVar2;
  this->first_group = pgVar2;
  std::
  allocator_traits<std::allocator<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group>>
  ::
  construct<plf::stack<MatchingStateDebugFailures,std::allocator<MatchingStateDebugFailures>>::group,unsigned_long&>
            ((allocator_type *)&this->group_allocator_pair,this->first_group,
             &this->min_block_capacity);
  pMVar1 = this->first_group->elements;
  this->start_element = pMVar1;
  this->top_element = pMVar1;
  this->end_element = this->first_group->end;
  return;
}

Assistant:

void initialize()
	{
		first_group = current_group = PLF_ALLOCATE(group_allocator_type, group_allocator_pair, 1, 0);

		// Initialize:
		try
		{
			#ifdef PLF_VARIADICS_SUPPORT
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, min_block_capacity);
			#else
				PLF_CONSTRUCT(group_allocator_type, group_allocator_pair, first_group, group(min_block_capacity));
			#endif
		}
		catch (...)
		{
			PLF_DEALLOCATE(group_allocator_type, group_allocator_pair, first_group, 1);
			first_group = current_group = NULL;
			throw;
		}

		top_element = start_element = first_group->elements;
		end_element = first_group->end;
	}